

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O2

char promptCalculationType(void)

{
  undefined8 in_RAX;
  ostream *poVar1;
  char answer;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::operator<<((ostream *)&std::cout,
                  "Would you like to calculate permutations (P) or combinations (C)? ");
  uStack_28._7_1_ = ' ';
  while( true ) {
    std::operator>>((istream *)&std::cin,(char *)((long)&uStack_28 + 7));
    if ((uStack_28._7_1_ == 'C') || (uStack_28._7_1_ == 'P')) break;
    poVar1 = std::operator<<((ostream *)&std::cerr,uStack_28._7_1_);
    std::operator<<(poVar1," is not a valid choice. The valid choices are: P or C\n");
  }
  return uStack_28._7_1_;
}

Assistant:

char promptCalculationType()
{
	std::cout << "Would you like to calculate permutations (P) or combinations (C)? ";
	char answer = ' ';
	while (true)
	{
		std::cin >> answer;
		if (answer == 'P' || answer == 'C')
			break;
		else
			std::cerr << answer << " is not a valid choice. The valid choices are: P or C\n";
		std::cin.rdbuf();
	}
	return answer;
}